

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O2

_Bool do_constant_folding_cond_eq(TCGCond c)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  uVar1 = c - TCG_COND_LT;
  if ((uVar1 < 0xc) && (in_RAX = 0xfcf, (0xfcfU >> (uVar1 & 0x1f) & 1) != 0)) {
    return (0x54aU >> (uVar1 & 0x1f) & 1) != 0;
  }
  fprintf(_stderr,"%s:%d: tcg fatal error\n",
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/optimize.c"
          ,499,in_R8,in_R9,in_RAX);
  abort();
}

Assistant:

static bool do_constant_folding_cond_eq(TCGCond c)
{
    switch (c) {
    case TCG_COND_GT:
    case TCG_COND_LTU:
    case TCG_COND_LT:
    case TCG_COND_GTU:
    case TCG_COND_NE:
        return 0;
    case TCG_COND_GE:
    case TCG_COND_GEU:
    case TCG_COND_LE:
    case TCG_COND_LEU:
    case TCG_COND_EQ:
        return 1;
    default:
        tcg_abort();
    }
}